

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

HMODULE LOADLoadLibrary(LPCSTR shortAsciiName,BOOL fDynamic)

{
  int iVar1;
  void *dl_handle_00;
  void *dl_handle;
  HMODULE module;
  char *pcStack_10;
  BOOL fDynamic_local;
  LPCSTR shortAsciiName_local;
  
  dl_handle = (void *)0x0;
  iVar1 = strcmp(shortAsciiName,"libc");
  pcStack_10 = shortAsciiName;
  if (iVar1 == 0) {
    pcStack_10 = "libc.so.6";
  }
  LockModuleList();
  dl_handle_00 = LOADLoadLibraryDirect(pcStack_10);
  if (dl_handle_00 != (void *)0x0) {
    dl_handle = LOADRegisterLibraryDirect(dl_handle_00,pcStack_10,fDynamic);
  }
  UnlockModuleList();
  return dl_handle;
}

Assistant:

static HMODULE LOADLoadLibrary(LPCSTR shortAsciiName, BOOL fDynamic)
{
    HMODULE module = nullptr;
    void *dl_handle = nullptr;

    // Check whether we have been requested to load 'libc'. If that's the case then use the
    // full name of the library that is defined in <gnu/lib-names.h> by the LIBC_SO constant.
    // The problem is that calling dlopen("libc.so") will fail for libc even thought it works
    // for other libraries. The reason is that libc.so is just linker script (i.e. a test file).
    // As a result, we have to use the full name (i.e. lib.so.6) that is defined by LIBC_SO.
    if (strcmp(shortAsciiName, LIBC_NAME_WITHOUT_EXTENSION) == 0)
    {
#if defined(__APPLE__)
        shortAsciiName = "libc.dylib";
#elif defined(__FreeBSD__)
        shortAsciiName = FREEBSD_LIBC;
#elif defined(LIBC_SO)
        shortAsciiName = LIBC_SO;
#else
        shortAsciiName = "libc.so";
#endif
    }

    LockModuleList();

    dl_handle = LOADLoadLibraryDirect(shortAsciiName);
    if (dl_handle)
    {
        module = LOADRegisterLibraryDirect(dl_handle, shortAsciiName, fDynamic);
    }

    UnlockModuleList();

    return module;
}